

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::ResetEntryPoint(FunctionBody *this)

{
  ScriptFunctionType *pSVar1;
  
  ClearEntryPoints(this);
  CreateNewDefaultEntryPoint(this);
  FunctionProxy::SetOriginalEntryPoint
            ((FunctionProxy *)this,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr)->jsMethod =
       (Type)((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk
  ;
  pSVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.deferredPrototypeType.ptr;
  if (pSVar1 != (ScriptFunctionType *)0x0) {
    (pSVar1->super_DynamicType).super_Type.entryPoint =
         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr)->
         jsMethod;
    Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierSet
              (&pSVar1->entryPointInfo,
               (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr);
  }
  pSVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.undeferredFunctionType.ptr;
  if (pSVar1 != (ScriptFunctionType *)0x0) {
    (pSVar1->super_DynamicType).super_Type.entryPoint =
         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr)->
         jsMethod;
    Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierSet
              (&pSVar1->entryPointInfo,
               (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr);
  }
  pSVar1 = (this->super_ParseableFunctionInfo).crossSiteDeferredFunctionType.ptr;
  if (pSVar1 != (ScriptFunctionType *)0x0) {
    Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierSet
              (&pSVar1->entryPointInfo,
               (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr);
  }
  pSVar1 = (this->super_ParseableFunctionInfo).crossSiteUndeferredFunctionType.ptr;
  if (pSVar1 != (ScriptFunctionType *)0x0) {
    Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierSet
              (&pSVar1->entryPointInfo,
               (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr);
  }
  ReinitializeExecutionModeAndLimits(this);
  return;
}

Assistant:

void FunctionBody::ResetEntryPoint()
    {
        ClearEntryPoints();
        this->CreateNewDefaultEntryPoint();
        this->SetOriginalEntryPoint(DefaultEntryThunk);
        m_defaultEntryPointInfo->jsMethod = m_scriptContext->CurrentThunk;

        if (this->deferredPrototypeType)
        {
            // Update old entry points on the deferred prototype type,
            // as they may point to old native code gen regions which are gone now.
            this->deferredPrototypeType->SetEntryPoint(this->GetDefaultEntryPointInfo()->jsMethod);
            this->deferredPrototypeType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->undeferredFunctionType)
        {
            this->undeferredFunctionType->SetEntryPoint(this->GetDefaultEntryPointInfo()->jsMethod);
            this->undeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->crossSiteDeferredFunctionType)
        {
            this->crossSiteDeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->crossSiteUndeferredFunctionType)
        {
            this->crossSiteUndeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        ReinitializeExecutionModeAndLimits();
    }